

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlNsPtrWrap(xmlNsPtr ns)

{
  PyObject *ret;
  xmlNsPtr ns_local;
  
  if (ns == (xmlNsPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    ns_local = (xmlNsPtr)&_Py_NoneStruct;
  }
  else {
    ns_local = (xmlNsPtr)PyCapsule_New(ns,"xmlNsPtr",0);
  }
  return (PyObject *)ns_local;
}

Assistant:

PyObject *
libxml_xmlNsPtrWrap(xmlNsPtr ns)
{
    PyObject *ret;

    if (ns == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) ns, (char *) "xmlNsPtr", NULL);
    return (ret);
}